

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsNodeQueue.cpp
# Opt level: O1

void __thiscall HighsNodeQueue::link_estim(HighsNodeQueue *this,int64_t node)

{
  NodeHybridEstimRbTree rbTree;
  RbTree<HighsNodeQueue::NodeHybridEstimRbTree> local_18;
  int64_t *local_10;
  HighsNodeQueue *local_8;
  
  local_18.rootNode = &this->hybridEstimRoot;
  local_10 = &this->hybridEstimMin;
  local_8 = this;
  ::highs::RbTree<HighsNodeQueue::NodeHybridEstimRbTree>::link
            (&local_18,(char *)node,(char *)local_10);
  return;
}

Assistant:

void HighsNodeQueue::link_estim(int64_t node) {
  assert(node != -1);
  NodeHybridEstimRbTree rbTree(this);
  rbTree.link(node);
}